

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::detail::bigint::remove_leading_zeros(bigint *this)

{
  int iVar1;
  type tVar2;
  int value;
  
  iVar1 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
  do {
    value = iVar1;
    if (value < 2) break;
    tVar2 = to_unsigned<int>(value + -1);
    iVar1 = value + -1;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[tVar2] == 0);
  tVar2 = to_unsigned<int>(value);
  buffer<unsigned_int>::resize((buffer<unsigned_int> *)this,(ulong)tVar2);
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }